

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOCC-CTA-cs16btech11038.cpp
# Opt level: O2

void __thiscall FOCC_CTA::FOCC_CTA(FOCC_CTA *this,int m)

{
  _Rb_tree_header *p_Var1;
  DataItem *this_00;
  int iVar2;
  undefined1 local_68 [8];
  _Rb_tree_node_base _Stack_60;
  size_t local_40;
  
  (this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->transactions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->transactions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->transactions)._M_t._M_impl.super__Rb_tree_header;
  (this->transactions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->transactions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->transactions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->scheduler_lock)._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->scheduler_lock)._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->scheduler_lock)._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->scheduler_lock)._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->scheduler_lock)._M_impl._M_rwlock + 0x20) = 0;
  (this->scheduler_lock)._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->scheduler_lock)._M_impl._M_rwlock + 0x30) = 0;
  this->M = m;
  this->counter = 0;
  local_68 = (undefined1  [8])0x0;
  _Stack_60._0_8_ = (pointer)0x0;
  _Stack_60._M_parent = (_Base_ptr)0x0;
  std::vector<DataItem_*,_std::allocator<DataItem_*>_>::_M_move_assign
            (&this->dataItems,(_Vector_base<DataItem_*,_std::allocator<DataItem_*>_> *)local_68);
  std::_Vector_base<DataItem_*,_std::allocator<DataItem_*>_>::~_Vector_base
            ((_Vector_base<DataItem_*,_std::allocator<DataItem_*>_> *)local_68);
  for (iVar2 = 0; iVar2 < this->M; iVar2 = iVar2 + 1) {
    this_00 = (DataItem *)operator_new(0x60);
    DataItem::DataItem(this_00,-2);
    local_68 = (undefined1  [8])this_00;
    std::vector<DataItem*,std::allocator<DataItem*>>::emplace_back<DataItem*>
              ((vector<DataItem*,std::allocator<DataItem*>> *)&this->dataItems,(DataItem **)local_68
              );
  }
  _Stack_60._M_left = &_Stack_60;
  local_68 = (undefined1  [8])0x0;
  _Stack_60._0_8_ = (pointer)0x0;
  _Stack_60._M_parent = (_Base_ptr)0x0;
  local_40 = 0;
  _Stack_60._M_right = _Stack_60._M_left;
  std::
  _Rb_tree<int,_std::pair<const_int,_Transaction_*>,_std::_Select1st<std::pair<const_int,_Transaction_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
  ::operator=(&(this->transactions)._M_t,
              (_Rb_tree<int,_std::pair<const_int,_Transaction_*>,_std::_Select1st<std::pair<const_int,_Transaction_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
               *)local_68);
  std::
  _Rb_tree<int,_std::pair<const_int,_Transaction_*>,_std::_Select1st<std::pair<const_int,_Transaction_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_Transaction_*>,_std::_Select1st<std::pair<const_int,_Transaction_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
               *)local_68);
  return;
}

Assistant:

FOCC_CTA::FOCC_CTA(int m): M(m){
    counter = 0;

    dataItems = std::vector<DataItem*>();
    for(int i=0; i<M; i++) dataItems.push_back(new DataItem(DataItem::INIT));

    transactions = std::map<int, Transaction*>();

}